

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  Enum EVar5;
  long lVar6;
  pointer pLVar8;
  pointer pLVar9;
  long lVar10;
  ulong uVar11;
  pointer pLVar12;
  ulong uVar7;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pLVar2 - (long)pLVar1 >> 3;
  uVar11 = lVar10 * -0x5555555555555555;
  if (uVar11 < 0x4000) {
    if (pLVar2 == (this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)pLVar2 - (long)pLVar1 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = 1;
      if (pLVar2 != pLVar1) {
        uVar7 = uVar11;
      }
      lVar6 = uVar7 + uVar11;
      if (lVar6 == 0) {
        pLVar8 = (pointer)0x0;
      }
      else {
        pLVar8 = (pointer)operator_new(lVar6 * 0x18);
      }
      (&pLVar8->label_type)[lVar10 * 2] = label_type;
      (&pLVar8->exprs)[lVar10] = first;
      (&pLVar8->context)[lVar10] = context;
      pLVar12 = pLVar8;
      for (pLVar9 = pLVar1; pLVar2 != pLVar9; pLVar9 = pLVar9 + 1) {
        pLVar12->context = pLVar9->context;
        uVar4 = *(undefined4 *)&pLVar9->field_0x4;
        pEVar3 = pLVar9->exprs;
        pLVar12->label_type = pLVar9->label_type;
        *(undefined4 *)&pLVar12->field_0x4 = uVar4;
        pLVar12->exprs = pEVar3;
        pLVar12 = pLVar12 + 1;
      }
      if (pLVar1 != (pointer)0x0) {
        operator_delete(pLVar1,(long)(this->label_stack_).
                                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pLVar1);
      }
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_start = pLVar8;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar12 + 1;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar8 + lVar6;
    }
    else {
      pLVar2->label_type = label_type;
      pLVar2->exprs = first;
      pLVar2->context = context;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + 1;
    }
    EVar5 = Ok;
  }
  else {
    PrintError(this,"label stack exceeds max nesting depth");
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderIR::PushLabel(LabelType label_type,
                                 ExprList* first,
                                 Expr* context) {
  if (label_stack_.size() >= kMaxNestingDepth) {
    PrintError("label stack exceeds max nesting depth");
    return Result::Error;
  }
  label_stack_.emplace_back(label_type, first, context);
  return Result::Ok;
}